

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O2

PackingRules spvtools::opt::StructPackingPass::ParsePackingRuleFromString(string *s)

{
  bool bVar1;
  PackingRules PVar2;
  
  bVar1 = std::operator==(s,"std140");
  if (bVar1) {
    PVar2 = Std140;
  }
  else {
    bVar1 = std::operator==(s,"std140EnhancedLayout");
    if (bVar1) {
      PVar2 = Std140EnhancedLayout;
    }
    else {
      bVar1 = std::operator==(s,"std430");
      if (bVar1) {
        PVar2 = Std430;
      }
      else {
        bVar1 = std::operator==(s,"std430EnhancedLayout");
        if (bVar1) {
          PVar2 = Std430EnhancedLayout;
        }
        else {
          bVar1 = std::operator==(s,"hlslCbuffer");
          if (bVar1) {
            PVar2 = HlslCbuffer;
          }
          else {
            bVar1 = std::operator==(s,"hlslCbufferPackOffset");
            if (bVar1) {
              PVar2 = HlslCbufferPackOffset;
            }
            else {
              bVar1 = std::operator==(s,"scalar");
              if (bVar1) {
                PVar2 = Scalar;
              }
              else {
                bVar1 = std::operator==(s,"scalarEnhancedLayout");
                PVar2 = (uint)bVar1 << 3;
              }
            }
          }
        }
      }
    }
  }
  return PVar2;
}

Assistant:

StructPackingPass::PackingRules StructPackingPass::ParsePackingRuleFromString(
    const std::string& s) {
  if (s == "std140") return PackingRules::Std140;
  if (s == "std140EnhancedLayout") return PackingRules::Std140EnhancedLayout;
  if (s == "std430") return PackingRules::Std430;
  if (s == "std430EnhancedLayout") return PackingRules::Std430EnhancedLayout;
  if (s == "hlslCbuffer") return PackingRules::HlslCbuffer;
  if (s == "hlslCbufferPackOffset") return PackingRules::HlslCbufferPackOffset;
  if (s == "scalar") return PackingRules::Scalar;
  if (s == "scalarEnhancedLayout") return PackingRules::ScalarEnhancedLayout;
  return PackingRules::Undefined;
}